

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O0

void __thiscall SStringView_REndEmpty_Test::TestBody(SStringView_REndEmpty_Test *this)

{
  bool bVar1;
  char *pcVar2;
  size_t length;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_8;
  Message local_1d0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_7;
  Message local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_6;
  Message local_190;
  int local_184;
  sstring_view<const_char_*> local_180;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_5;
  Message local_158;
  int local_14c;
  sstring_view<const_char_*> local_148;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_4;
  Message local_120;
  int local_114;
  sstring_view<const_char_*> local_110;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_3;
  Message local_e8;
  undefined1 local_e0 [8];
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_2;
  Message local_c0;
  undefined1 local_b8 [8];
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98;
  undefined1 local_90 [8];
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  const_reverse_iterator const_rend2;
  const_reverse_iterator const_rend1;
  reverse_iterator rend;
  sv_type *csv;
  sv_type sv;
  allocator local_31;
  string local_30 [8];
  string src;
  SStringView_REndEmpty_Test *this_local;
  
  src.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pcVar2 = (char *)std::__cxx11::string::data();
  length = std::__cxx11::string::length();
  pstore::make_sstring_view(pcVar2,length);
  pstore::sstring_view<const_char_*>::rend((sstring_view<const_char_*> *)&const_rend1);
  pstore::sstring_view<const_char_*>::rend((sstring_view<const_char_*> *)&const_rend2);
  pstore::sstring_view<const_char_*>::crend((sstring_view<const_char_*> *)&gtest_ar.message_);
  pstore::sstring_view<const_char_*>::rbegin((sstring_view<const_char_*> *)local_90);
  testing::internal::EqHelper::
  Compare<std::reverse_iterator<const_char_*>,_std::reverse_iterator<const_char_*>,_nullptr>
            ((EqHelper *)local_88,"rend","sv.rbegin ()",
             (reverse_iterator<const_char_*> *)&const_rend1,
             (reverse_iterator<const_char_*> *)local_90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0xf4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  pstore::sstring_view<const_char_*>::rbegin((sstring_view<const_char_*> *)local_b8);
  testing::internal::EqHelper::
  Compare<std::reverse_iterator<const_char_*>,_std::reverse_iterator<const_char_*>,_nullptr>
            ((EqHelper *)local_b0,"const_rend1","csv.rbegin ()",&const_rend2,
             (reverse_iterator<const_char_*> *)local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0xf5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  pstore::sstring_view<const_char_*>::rbegin((sstring_view<const_char_*> *)local_e0);
  testing::internal::EqHelper::
  Compare<std::reverse_iterator<const_char_*>,_std::reverse_iterator<const_char_*>,_nullptr>
            ((EqHelper *)local_d8,"const_rend2","sv.rbegin ()",
             (reverse_iterator<const_char_*> *)&gtest_ar.message_,
             (reverse_iterator<const_char_*> *)local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0xf6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  pstore::sstring_view<const_char_*>::rbegin(&local_110);
  local_110.size_ = std::operator-(&const_rend1,(reverse_iterator<const_char_*> *)&local_110);
  local_114 = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_100,"rend - sv.rbegin ()","0",(long *)&local_110.size_,&local_114);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0xf8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  pstore::sstring_view<const_char_*>::rbegin(&local_148);
  local_148.size_ = std::operator-(&const_rend2,(reverse_iterator<const_char_*> *)&local_148);
  local_14c = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_138,"const_rend1 - csv.rbegin ()","0",(long *)&local_148.size_,
             &local_14c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0xf9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  pstore::sstring_view<const_char_*>::crbegin(&local_180);
  local_180.size_ =
       std::operator-((reverse_iterator<const_char_*> *)&gtest_ar.message_,
                      (reverse_iterator<const_char_*> *)&local_180);
  local_184 = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_170,"const_rend2 - sv.crbegin ()","0",(long *)&local_180.size_,
             &local_184);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0xfa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  testing::internal::EqHelper::
  Compare<std::reverse_iterator<const_char_*>,_std::reverse_iterator<const_char_*>,_nullptr>
            ((EqHelper *)local_1a8,"rend","const_rend1",&const_rend1,&const_rend2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0xfc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  testing::internal::EqHelper::
  Compare<std::reverse_iterator<const_char_*>,_std::reverse_iterator<const_char_*>,_nullptr>
            ((EqHelper *)local_1c8,"rend","const_rend2",&const_rend1,
             (reverse_iterator<const_char_*> *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0xfd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  testing::internal::EqHelper::
  Compare<std::reverse_iterator<const_char_*>,_std::reverse_iterator<const_char_*>,_nullptr>
            ((EqHelper *)local_1e8,"const_rend1","const_rend2",&const_rend2,
             (reverse_iterator<const_char_*> *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0xfe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST (SStringView, REndEmpty) {
    std::string const src{""};
    using sv_type = pstore::sstring_view<char const *>;
    sv_type sv = pstore::make_sstring_view (src.data (), src.length ());
    sv_type const & csv = sv;

    sv_type::reverse_iterator rend = sv.rend ();
    sv_type::const_reverse_iterator const_rend1 = csv.rend ();
    sv_type::const_reverse_iterator const_rend2 = sv.crend ();

    EXPECT_EQ (rend, sv.rbegin ());
    EXPECT_EQ (const_rend1, csv.rbegin ());
    EXPECT_EQ (const_rend2, sv.rbegin ());

    EXPECT_EQ (rend - sv.rbegin (), 0);
    EXPECT_EQ (const_rend1 - csv.rbegin (), 0);
    EXPECT_EQ (const_rend2 - sv.crbegin (), 0);

    EXPECT_EQ (rend, const_rend1);
    EXPECT_EQ (rend, const_rend2);
    EXPECT_EQ (const_rend1, const_rend2);
}